

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_relative *s)

{
  Expression *pEVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  string *this_00;
  string symbol;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &symbol;
  ast::Instruction::check_alignment((Instruction *)s);
  uVar2 = s->ldst;
  if ((uVar2 & 2) != 0) {
    std::__cxx11::string::string
              ((string *)&local_48,
               "str instructions with PC relative address doesn\'t exist, only ldr exists",
               (allocator *)&symbol);
    error_report((Location *)&s->field_0x28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    uVar2 = s->ldst;
  }
  if (uVar2 == 1) {
    std::__cxx11::string::string
              ((string *)&local_68,
               "ldrb instruction with PC relative address doesn\'t exist, only ldr exists",
               (allocator *)&symbol);
    error_report((Location *)&s->field_0x28,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  uVar2 = s->rd->n;
  iVar3 = (*s->target->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar1 = s->target;
    if (pEVar1->type == LABEL) {
      (*pEVar1->_vptr_Expression[4])(&symbol,pEVar1);
      pEVar1 = s->target;
      iVar3 = pEVar1->value;
      plVar4 = (long *)operator_new(0x50);
      *plVar4 = (long)&s->field_0x28;
      plVar4[1] = (long)&pEVar1->location;
      plVar4[2] = *(long *)&s->field_0x40;
      plVar4[3] = 0x600000004;
      *(undefined4 *)(plVar4 + 4) = 2;
      std::__cxx11::string::string((string *)(plVar4 + 5),(string *)&symbol);
      *(uint *)(plVar4 + 9) = (ushort)iVar3 - 2;
      ast::Relocations::add((Relocation *)0x11dc25);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_88,"Invalid expression, must be a label",(allocator *)&symbol);
      error_report(&pEVar1->location,&local_88);
      this_00 = &local_88;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  ast::Sections::write16(*(uint *)&s->field_0x40,*(uint *)&s->field_0x44,(short)uVar2 + 0xc00);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_relative *s)
{
	s->check_alignment();
	if ((s->ldst & 2) != 0) // is a STR
		error_report(&s->location, "str instructions with PC relative address doesn't exist, only ldr exists");
	if (s->ldst == 1)       // is a LDRB
		error_report(&s->location, "ldrb instruction with PC relative address doesn't exist, only ldr exists");
	unsigned code = LDR_RELATIVE_OPCODE + (s->rd->n << RD_POSITION);
	if (s->target->evaluate()) {
		auto target_type = s->target->get_type();
		if (target_type == Value_type::LABEL) {
			string symbol = s->target->get_symbol();
			auto addend = s->target->get_value() - 2;
			auto *reloc = new Relocation{&s->location, &s->target->location, s->section_index, s->section_offset,
							LDR_RELATIVE_CONSTANT_POSITION, LDR_RELATIVE_CONSTANT_SIZE,
							Relocation::Relocation_type::RELATIVE_UNSIGNED, symbol, addend};
			Relocations::add(reloc);
		}
		else
			error_report(&s->target->location, "Invalid expression, must be a label");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}